

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belongingStructure.cpp
# Opt level: O0

void pushNew(BelongStructure *bs,float atk,int *belonging)

{
  int local_2c;
  value_type piStack_28;
  int i;
  int *ptr;
  int *belonging_local;
  BelongStructure *pBStack_10;
  float atk_local;
  BelongStructure *bs_local;
  
  if (bs->biggestAtk - (float)nearing_coef <= atk) {
    ptr = belonging;
    belonging_local._4_4_ = atk;
    pBStack_10 = bs;
    piStack_28 = (value_type)operator_new__(0x40);
    for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
      piStack_28[local_2c] = ptr[local_2c];
    }
    std::vector<int_*,_std::allocator<int_*>_>::push_back
              (&pBStack_10->belongings,&stack0xffffffffffffffd8);
    std::vector<float,_std::allocator<float>_>::push_back
              (&pBStack_10->as,(value_type_conflict *)((long)&belonging_local + 4));
  }
  return;
}

Assistant:

void pushNew(BelongStructure *bs,float atk,int *belonging){
        if(atk<bs->biggestAtk-nearing_coef)return;
        int *ptr = new int[16];
        for(int i=0;i<16;i++)
            ptr[i]=belonging[i];
        bs->belongings.push_back(ptr);
        bs->as.push_back(atk);
    }